

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

node_type * __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
::new_internal_node(btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
                    *this,node_type *parent)

{
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
  *this_00;
  
  this_00 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
             *)Allocate<8ul,std::allocator<int>>((allocator<int> *)this,0x2f0);
  if (((ulong)this_00 & 7) == 0) {
    *(node_type **)this_00 = parent;
    *(undefined4 *)(this_00 + 8) = 0;
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::KeyCompareToWeakOrdering,_std::allocator<int>,_256,_false>_>
    ::mutable_child(this_00,0);
    return this_00;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::KeyCompareToWeakOrdering, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
               );
}

Assistant:

node_type* new_internal_node(node_type *parent) {
            node_type *p = allocate(node_type::InternalSize());
            return node_type::init_internal(p, parent);
        }